

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

bool ONX_Model::GetRDKEmbeddedFilePaths(ONX_Model_UserData *docud,ON_ClassArray<ON_wString> *paths)

{
  bool bVar1;
  int count_00;
  undefined1 local_260 [4];
  int count;
  ON_Read3dmBufferArchive archive;
  ON_ClassArray<ON_wString> *paths_local;
  ONX_Model_UserData *docud_local;
  
  archive.m_reserved4 = (ON__INT_PTR)paths;
  bVar1 = ::IsRDKDocumentInformation(docud);
  if (bVar1) {
    ON_Read3dmBufferArchive::ON_Read3dmBufferArchive
              ((ON_Read3dmBufferArchive *)local_260,(long)(docud->m_goo).m_value,
               (docud->m_goo).m_goo,false,docud->m_usertable_3dm_version,
               docud->m_usertable_opennurbs_version);
    count_00 = SeekArchiveToEmbeddedFiles
                         ((ON_Read3dmBufferArchive *)local_260,(docud->m_goo).m_value);
    docud_local._7_1_ =
         ReadEmbeddedFilePathsFromArchive
                   ((ON_Read3dmBufferArchive *)local_260,count_00,
                    (ON_ClassArray<ON_wString> *)archive.m_reserved4);
    ON_Read3dmBufferArchive::~ON_Read3dmBufferArchive((ON_Read3dmBufferArchive *)local_260);
  }
  else {
    docud_local._7_1_ = false;
  }
  return docud_local._7_1_;
}

Assistant:

bool ONX_Model::GetRDKEmbeddedFilePaths(const ONX_Model_UserData& docud, ON_ClassArray<ON_wString>& paths)
{
  if (!::IsRDKDocumentInformation(docud))
    return false;

  ON_Read3dmBufferArchive archive(docud.m_goo.m_value, docud.m_goo.m_goo, false, docud.m_usertable_3dm_version, docud.m_usertable_opennurbs_version);

  const int count = SeekArchiveToEmbeddedFiles(archive, docud.m_goo.m_value);
  if (!ReadEmbeddedFilePathsFromArchive(archive, count, paths))
    return false;

  return true;
}